

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_aec.c
# Opt level: O0

int encode_decode_large(test_state *state)

{
  int iVar1;
  FILE *__stream;
  int local_c5c;
  int local_c58;
  int i_2;
  int i_1;
  int i;
  FILE *fp_1;
  char fname_1 [1027];
  FILE *fp;
  char fname [1028];
  aec_stream *strm;
  char fbase [1024];
  size_t to;
  int bflags;
  int status;
  test_state *state_local;
  
  to._0_4_ = 0;
  unique0x00012000 = (aec_stream_conflict *)state->strm;
  unique0x00012000->avail_in = state->ibuf_len;
  unique0x00012000->avail_out = state->cbuf_len;
  unique0x00012000->next_in = state->ubuf;
  unique0x00012000->next_out = state->cbuf;
  iVar1 = aec_encode_init((aec_stream *)unique0x00012000);
  if (iVar1 == 0) {
    if (state->dump != 0) {
      snprintf((char *)&strm,0x400,"BPS%02iID%iBS%02iRSI%04iFLG%04i",
               (ulong)stack0xfffffffffffffbd0->bits_per_sample,(ulong)(uint)state->id,
               (ulong)stack0xfffffffffffffbd0->block_size,stack0xfffffffffffffbd0->rsi,
               stack0xfffffffffffffbd0->flags);
      snprintf((char *)&fp,0x404,"%s.dat",&strm);
      register0x00000000 = fopen((char *)&fp,"wb");
      if (register0x00000000 == (FILE *)0x0) {
        fprintf(_stderr,"ERROR: cannot open dump file %s\n",&fp);
        return 99;
      }
      fputc(stack0xfffffffffffffbd0->bits_per_sample,register0x00000000);
      to._0_4_ = stack0xfffffffffffffbd0->block_size >> 8;
      if ((stack0xfffffffffffffbd0->flags | 4) != 0) {
        to._0_4_ = (uint)to | 0x80;
      }
      if ((stack0xfffffffffffffbd0->flags | 1) != 0) {
        to._0_4_ = (uint)to | 0x40;
      }
      if ((stack0xfffffffffffffbd0->flags | 2) != 0) {
        to._0_4_ = (uint)to | 0x10;
      }
      to._0_4_ = (uint)to | 0x20;
      fputc((uint)to,stack0xfffffffffffff7c0);
      fwrite(stack0xfffffffffffffbd0->next_in,stack0xfffffffffffffbd0->avail_in,1,
             stack0xfffffffffffff7c0);
      fclose(stack0xfffffffffffff7c0);
    }
    iVar1 = aec_encode((aec_stream *)stack0xfffffffffffffbd0,1);
    if (iVar1 == 0) {
      aec_encode_end((aec_stream *)stack0xfffffffffffffbd0);
      if (state->dump != 0) {
        snprintf((char *)&fp_1,0x403,"%s.rz",&strm);
        __stream = fopen((char *)&fp_1,"wb");
        if (__stream == (FILE *)0x0) {
          fprintf(_stderr,"ERROR: cannot open dump file %s\n",&fp_1);
          return 99;
        }
        fputc(stack0xfffffffffffffbd0->bits_per_sample,__stream);
        fputc((uint)to & 0xffffffdf,__stream);
        fwrite(state->cbuf,stack0xfffffffffffffbd0->total_out,1,__stream);
        fclose(__stream);
      }
      stack0xfffffffffffffbd0->avail_in = stack0xfffffffffffffbd0->total_out;
      stack0xfffffffffffffbd0->avail_out = state->buf_len;
      stack0xfffffffffffffbd0->next_in = state->cbuf;
      stack0xfffffffffffffbd0->next_out = state->obuf;
      fbase._1016_8_ = stack0xfffffffffffffbd0->total_out;
      iVar1 = aec_decode_init(stack0xfffffffffffffbd0);
      if (iVar1 == 0) {
        iVar1 = aec_decode(stack0xfffffffffffffbd0,1);
        if (iVar1 == 0) {
          iVar1 = memcmp(state->ubuf,state->obuf,state->ibuf_len);
          if (iVar1 == 0) {
            aec_decode_end(stack0xfffffffffffffbd0);
            state_local._4_4_ = 0;
          }
          else {
            printf("\n%s: Uncompressed output differs from input.\n","\x1b[0;31mFAIL\x1b[0m");
            printf("\nuncompressed buf");
            for (i_2 = 0; i_2 < 0x50; i_2 = i_2 + 1) {
              if (i_2 % 8 == 0) {
                printf("\n");
              }
              printf("%02x ",(ulong)state->ubuf[i_2]);
            }
            printf("\n\ncompressed buf len %zu",fbase._1016_8_);
            for (local_c58 = 0; local_c58 < 0x50; local_c58 = local_c58 + 1) {
              if (local_c58 % 8 == 0) {
                printf("\n");
              }
              printf("%02x ",(ulong)state->cbuf[local_c58]);
            }
            printf("\n\ndecompressed buf");
            for (local_c5c = 0; local_c5c < 0x50; local_c5c = local_c5c + 1) {
              if (local_c5c % 8 == 0) {
                printf("\n");
              }
              printf("%02x ",(ulong)state->obuf[local_c5c]);
            }
            printf("\n");
            state_local._4_4_ = 99;
          }
        }
        else {
          printf("Decode failed.\n");
          state_local._4_4_ = 99;
        }
      }
      else {
        printf("Init failed.\n");
        state_local._4_4_ = 99;
      }
    }
    else {
      printf("Encode failed.\n");
      state_local._4_4_ = 99;
    }
  }
  else {
    printf("Init failed.\n");
    state_local._4_4_ = 99;
  }
  return state_local._4_4_;
}

Assistant:

int encode_decode_large(struct test_state *state)
{
    int status;
    int bflags = 0;
    size_t to;
    char fbase[1024];
    struct aec_stream *strm = state->strm;

    strm->avail_in = state->ibuf_len;
    strm->avail_out = state->cbuf_len;
    strm->next_in = state->ubuf;
    strm->next_out = state->cbuf;

    status = aec_encode_init(strm);
    if (status != AEC_OK) {
        printf("Init failed.\n");
        return 99;
    }
    if (state->dump) {
        char fname[1024 + 4];
        FILE *fp;
        snprintf(fbase, sizeof(fbase), "BPS%02iID%iBS%02iRSI%04iFLG%04i",
                 strm->bits_per_sample,
                 state->id,
                 strm->block_size,
                 strm->rsi,
                 strm->flags);
        snprintf(fname, sizeof(fname), "%s.dat", fbase);
        if ((fp = fopen(fname, "wb")) == NULL) {
            fprintf(stderr, "ERROR: cannot open dump file %s\n", fname);
            return 99;
        }
        fputc(strm->bits_per_sample, fp);
        bflags = strm->block_size >> 8;
        if (strm->flags | AEC_DATA_MSB)
            bflags |= 0x80;
        if (strm->flags | AEC_DATA_SIGNED)
            bflags |= 0x40;
        if (strm->flags | AEC_DATA_3BYTE)
            bflags |= 0x10;
        bflags |= 0x20; /* encode */
        fputc(bflags, fp);
        fwrite(strm->next_in, strm->avail_in, 1, fp);
        fclose(fp);
    }

    status = aec_encode(strm, AEC_FLUSH);
    if (status != AEC_OK) {
        printf("Encode failed.\n");
        return 99;
    }

    aec_encode_end(strm);

    if (state->dump) {
        char fname[1024 + 3];
        FILE *fp;
        snprintf(fname, sizeof(fname), "%s.rz", fbase);
        if ((fp = fopen(fname, "wb")) == NULL) {
            fprintf(stderr, "ERROR: cannot open dump file %s\n", fname);
            return 99;
        }
        fputc(strm->bits_per_sample, fp);
        bflags &= ~0x20;
        fputc(bflags, fp);
        fwrite(state->cbuf, strm->total_out, 1, fp);
        fclose(fp);
    }

    strm->avail_in = strm->total_out;
    strm->avail_out = state->buf_len;
    strm->next_in = state->cbuf;
    strm->next_out = state->obuf;
    to = strm->total_out;

    status = aec_decode_init(strm);
    if (status != AEC_OK) {
        printf("Init failed.\n");
        return 99;
    }

    status = aec_decode(strm, AEC_FLUSH);
    if (status != AEC_OK) {
        printf("Decode failed.\n");
        return 99;
    }

    if (memcmp(state->ubuf, state->obuf, state->ibuf_len)) {
        printf("\n%s: Uncompressed output differs from input.\n", CHECK_FAIL);

        printf("\nuncompressed buf");
        for (int i = 0; i < 80; i++) {
            if (i % 8 == 0)
                printf("\n");
            printf("%02x ", state->ubuf[i]);
        }
        printf("\n\ncompressed buf len %zu", to);
        for (int i = 0; i < 80; i++) {
            if (i % 8 == 0)
                printf("\n");
            printf("%02x ", state->cbuf[i]);
        }
        printf("\n\ndecompressed buf");
        for (int i = 0; i < 80; i++) {
            if (i % 8 == 0)
                printf("\n");
            printf("%02x ", state->obuf[i]);
        }
        printf("\n");
        return 99;
    }
    aec_decode_end(strm);
    return 0;
}